

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shmemory.cpp
# Opt level: O3

SHMPTR SHMalloc(size_t size)

{
  Volatile<void_*> VVar1;
  int iVar2;
  SHMPTR *pSVar3;
  void *pvVar4;
  ulong uVar5;
  SHMPTR SVar6;
  LPVOID pvVar7;
  int *piVar8;
  SHMPTR SVar9;
  int num_blocks;
  long lVar10;
  int *piVar11;
  long lVar12;
  undefined1 auVar13 [16];
  
  if (!PAL_InitializeChakraCoreCalled) goto LAB_00136aec;
  if (size == 0) {
    return 0;
  }
  piVar8 = block_sizes;
  lVar10 = 0;
  while ((ulong)(long)*piVar8 < size) {
    piVar8 = (int *)((uint *)piVar8 + 1);
    lVar10 = lVar10 + 6;
    if (lVar10 == 0x18) {
      fprintf(_stderr,"] %s %s:%d","SHMalloc",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/shmemory/shmemory.cpp"
              ,0x247);
      fprintf(_stderr,"Got request for shared memory block of %u bytes; maximum block size is %d.\n"
              ,size,0x808);
      return 0;
    }
  }
  SHMLock();
  VVar1 = shm_segment_bases[0];
  if (*(int *)((long)shm_segment_bases[0].m_val + lVar10 * 4 + 0x50) == 0) {
    if (PAL_InitializeChakraCoreCalled == false) goto LAB_00136aec;
    if (shm_numsegments != 0x100) {
      pvVar4 = mmap64((void *)0x0,0x40000,3,0x22,-1,0);
      if (pvVar4 != (void *)0xffffffffffffffff) {
        shm_segment_bases[shm_numsegments].m_val = pvVar4;
        if (PAL_InitializeChakraCoreCalled != true) goto LAB_00136aec;
        auVar13._0_4_ =
             *(int *)((long)shm_segment_bases[0].m_val + 0x4c) -
             *(int *)((long)shm_segment_bases[0].m_val + 0x50);
        auVar13._4_4_ =
             *(int *)((long)shm_segment_bases[0].m_val + 100) -
             *(int *)((long)shm_segment_bases[0].m_val + 0x68);
        auVar13._8_4_ =
             *(int *)((long)shm_segment_bases[0].m_val + 0x7c) -
             *(int *)((long)shm_segment_bases[0].m_val + 0x80);
        auVar13._12_4_ =
             *(int *)((long)shm_segment_bases[0].m_val + 0x94) -
             *(int *)((long)shm_segment_bases[0].m_val + 0x98);
        auVar13 = pmulld(auVar13,(undefined1  [16])block_sizes);
        auVar13 = phaddd(auVar13,auVar13);
        piVar11 = (int *)((long)shm_segment_bases[0].m_val + 0x4c);
        auVar13 = phaddd(auVar13,auVar13);
        SVar9 = (SHMPTR)(int)(shm_numsegments << 0x18 | 0x40);
        lVar12 = 0;
        do {
          if ((PAL_InitializeChakraCoreCalled & 1U) == 0) goto LAB_00136aec;
          iVar2 = *(int *)((long)block_sizes + lVar12);
          uVar5 = ((long)((*piVar11 - piVar11[1]) * iVar2) * 0x3f748) / (long)auVar13._0_4_;
          num_blocks = (int)((long)((ulong)(uint)((int)uVar5 >> 0x1f) << 0x20 | uVar5 & 0xffffffff)
                            / (long)iVar2) + 1;
          *(SHMPTR *)((long)pvVar4 + lVar12 * 2) = SVar9;
          SVar6 = SHMLinkPool(SVar9,iVar2,num_blocks);
          *(SHMPTR *)((long)pvVar4 + lVar12 * 2 + 0x20) = SVar6;
          *(undefined8 *)
           ((long)shm_segment_bases[*(ulong *)((long)pvVar4 + lVar12 * 2 + 0x20) >> 0x18 & 0xff].
                  m_val +
           (ulong)((uint)*(undefined8 *)((long)pvVar4 + lVar12 * 2 + 0x20) & 0xffffff)) =
               *(undefined8 *)(piVar11 + 3);
          *(undefined8 *)(piVar11 + 3) = *(undefined8 *)((long)pvVar4 + lVar12 * 2);
          *(ulong *)piVar11 =
               CONCAT44(num_blocks + (int)((ulong)*(undefined8 *)piVar11 >> 0x20),
                        num_blocks + (int)*(undefined8 *)piVar11);
          if (PAL_InitializeChakraCoreCalled == false) goto LAB_00136aec;
          SVar9 = SVar9 + (long)(num_blocks * iVar2);
          lVar12 = lVar12 + 4;
          piVar11 = piVar11 + 6;
        } while (lVar12 != 0x10);
        shm_numsegments = shm_numsegments + 1;
        goto LAB_00136726;
      }
      if (PAL_InitializeChakraCoreCalled == false) goto LAB_00136aec;
      piVar8 = __errno_location();
      strerror(*piVar8);
    }
    if ((PAL_InitializeChakraCoreCalled & 1U) != 0) {
      lock_count.m_val = lock_count.m_val + -1;
      CCLock::Leave(&shm_critsec);
      return 0;
    }
    goto LAB_00136aec;
  }
LAB_00136726:
  SVar9 = *(SHMPTR *)((long)VVar1.m_val + lVar10 * 4 + 0x58);
  pSVar3 = (SHMPTR *)SHMPtrToPtr(SVar9);
  if (SVar9 == 0) {
    fprintf(_stderr,"] %s %s:%d","SHMalloc",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/shmemory/shmemory.cpp"
            ,0x268);
    fprintf(_stderr,"First free block in %d-byte pool (%08x) was invalid!\n",(ulong)(uint)*piVar8,0)
    ;
    lock_count.m_val = lock_count.m_val + -1;
    CCLock::Leave(&shm_critsec);
    return 0;
  }
  SVar6 = *pSVar3;
  *(SHMPTR *)((long)VVar1.m_val + lVar10 * 4 + 0x58) = SVar6;
  iVar2 = *(int *)((long)VVar1.m_val + lVar10 * 4 + 0x50) + -1;
  *(int *)((long)VVar1.m_val + lVar10 * 4 + 0x50) = iVar2;
  if (((iVar2 == 0) && (SVar6 != 0)) || ((iVar2 != 0 && (SVar6 == 0)))) {
    fprintf(_stderr,"] %s %s:%d","SHMalloc",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/shmemory/shmemory.cpp"
            ,0x278);
    fprintf(_stderr,"free block count is %d, but next free block is %#x\n",
            (ulong)*(uint *)((long)VVar1.m_val + lVar10 * 4 + 0x50),SVar6);
LAB_001367b8:
    *(undefined8 *)((long)VVar1.m_val + lVar10 * 4 + 0x58) = 0;
    *(undefined4 *)((long)VVar1.m_val + lVar10 * 4 + 0x50) = 0;
  }
  else if ((SVar6 != 0) && (pvVar7 = SHMPtrToPtr(SVar6), pvVar7 == (LPVOID)0x0)) {
    fprintf(_stderr,"] %s %s:%d","SHMalloc",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/shmemory/shmemory.cpp"
            ,0x280);
    fprintf(_stderr,"Next free block (%#x) in %d-byte pool is invalid!\n",SVar6,(ulong)(uint)*piVar8
           );
    goto LAB_001367b8;
  }
  lock_count.m_val = lock_count.m_val + -1;
  CCLock::Leave(&shm_critsec);
  if (PAL_InitializeChakraCoreCalled != false) {
    return SVar9;
  }
LAB_00136aec:
  abort();
}

Assistant:

SHMPTR SHMalloc(size_t size)
{
    enum SHM_POOL_SIZES sps;
    SHMPTR first_free;
    SHMPTR next_free;
    SHM_FIRST_HEADER *header;
    SHMPTR *shmptr_ptr;

    TRACE("SHMalloc() called; requested size is %u\n", size);

    if(0 == size)
    {
        WARN("Got a request for a 0-byte block! returning 0\n");
        return 0;
    }

    /* Find the first block size >= requested size */
    for (sps = static_cast<SHM_POOL_SIZES>(0); sps < SPS_LAST;
         sps = static_cast<SHM_POOL_SIZES>(sps + 1))
    {
        if (size <= static_cast<size_t>(block_sizes[sps]))
        {
            break;
        }
    }

    /* If no block size is found, requested size was too large. */
    if( SPS_LAST == sps )
    {
        ASSERT("Got request for shared memory block of %u bytes; maximum block "
              "size is %d.\n", size, block_sizes[SPS_LAST-1]);
        return 0;
    }

    TRACE("Best block size is %d (%d bytes wasted)\n",
          block_sizes[sps], block_sizes[sps]-size );

    log_waste(sps, block_sizes[sps]-size);

    SHMLock();
    header = (SHM_FIRST_HEADER *)shm_segment_bases[0].Load();

    /* If there are no free items of the specified size left, it's time to
       allocate a new shared memory segment.*/
    if(header->pools[sps].free_items == 0)
    {
        TRACE("No blocks of %d bytes left; allocating new segment.\n",
              block_sizes[sps]);
        if(!SHMAddSegment())
        {
            ERROR("Unable to allocate new shared memory segment!\n");
            SHMRelease();
            return 0;
        }
    }

    /* Remove the first free block from the pool */
    first_free = header->pools[sps].first_free;
    shmptr_ptr = static_cast<SHMPTR*>(SHMPTR_TO_PTR(first_free));

    if( 0 == first_free )
    {
        ASSERT("First free block in %d-byte pool (%08x) was invalid!\n",
              block_sizes[sps], first_free);
        SHMRelease();
        return 0;
    }

    /* the block "first_free" is the head of a linked list of free blocks;
       take the next link in the list and set it as new head of list. */
    next_free = *shmptr_ptr;
    header->pools[sps].first_free = next_free;
    header->pools[sps].free_items--;

    /* make sure we're still in a sane state */
    if(( 0 == header->pools[sps].free_items && 0 != next_free) ||
       ( 0 != header->pools[sps].free_items && 0 == next_free))
    {
        ASSERT("free block count is %d, but next free block is %#x\n",
               header->pools[sps].free_items, next_free);
        /* assume all remaining blocks in the pool are corrupt */
        header->pools[sps].first_free = 0;
        header->pools[sps].free_items = 0;
    }
    else if (0 != next_free && 0 == SHMPTR_TO_PTR(next_free) )
    {
        ASSERT("Next free block (%#x) in %d-byte pool is invalid!\n",
               next_free, block_sizes[sps]);
        /* assume all remaining blocks in the pool are corrupt */
        header->pools[sps].first_free = 0;
        header->pools[sps].free_items = 0;
    }

    SHMRelease();

    TRACE("Allocation successful; %d blocks of %d bytes left. Returning %08x\n",
          header->pools[sps].free_items, block_sizes[sps], first_free);
    return first_free;
}